

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O1

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::add_packed_fixed<long,short_const*>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,short *first,short *last)

{
  short sVar1;
  ulong size;
  
  if (first != last) {
    size = ((long)last - (long)first) * 4;
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::add_field((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this,tag,length_delimited);
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::add_varint((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,size & 0xffffffff);
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reserve((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,size);
    do {
      sVar1 = *first;
      first = first + 1;
      basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::add_fixed<long>((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,(long)sVar1);
    } while (first != last);
  }
  return;
}

Assistant:

void add_packed_fixed(pbf_tag_type tag, It first, It last, std::forward_iterator_tag /*unused*/) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        const auto length = std::distance(first, last);
        add_length_varint(tag, sizeof(T) * pbf_length_type(length));
        reserve(sizeof(T) * std::size_t(length));

        while (first != last) {
            add_fixed<T>(*first++);
        }
    }